

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O0

float __thiscall Timer::toc(Timer *this)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__rhs;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_RDI;
  float fVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffe8;
  
  __rhs = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           *)std::chrono::_V2::system_clock::now();
  std::chrono::operator-(in_stack_ffffffffffffffe8,__rhs);
  std::chrono::
  duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
            (in_RDI);
  std::chrono::duration<long,_std::ratio<1L,_1000L>_>::operator+=
            ((duration<long,_std::ratio<1L,_1000L>_> *)__rhs,
             (duration<long,_std::ratio<1L,_1000L>_> *)in_RDI);
  fVar1 = get((Timer *)0x20fee9);
  return fVar1;
}

Assistant:

float Timer::toc() {
  duration += std::chrono::duration_cast<std::chrono::milliseconds>
              (std::chrono::high_resolution_clock::now()-begin);
  return get();
}